

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O1

void __thiscall llvm::printEscapedString(llvm *this,StringRef Name,raw_ostream *Out)

{
  llvm lVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  uchar UC;
  raw_ostream *prVar5;
  size_t __n;
  llvm *__n_00;
  raw_ostream *this_00;
  raw_ostream *extraout_RDX;
  uint __fd;
  char *pcVar6;
  raw_ostream *__buf;
  
  this_00 = (raw_ostream *)Name.Length;
  if ((int)Name.Data != 0) {
    pcVar6 = (char *)0x0;
    __buf = this_00;
    do {
      if (Name.Data <= pcVar6) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      lVar1 = this[(long)pcVar6];
      __fd = (uint)(byte)lVar1;
      prVar5 = this_00;
      if ((((byte)((byte)lVar1 - 0x20) < 0x5f) && (lVar1 != (llvm)0x22)) && (lVar1 != (llvm)0x5c)) {
        __n_00 = (llvm *)this_00->OutBufCur;
        if (__n_00 < (llvm *)this_00->OutBufEnd) {
          __buf = (raw_ostream *)(__n_00 + 1);
          this_00->OutBufCur = (char *)__buf;
          *__n_00 = lVar1;
        }
        else {
LAB_00185b97:
          raw_ostream::write(prVar5,__fd,__buf,(size_t)__n_00);
          __buf = extraout_RDX;
        }
      }
      else {
        pcVar2 = this_00->OutBufCur;
        if (pcVar2 < this_00->OutBufEnd) {
          this_00->OutBufCur = pcVar2 + 1;
          *pcVar2 = '\\';
        }
        else {
          prVar5 = (raw_ostream *)raw_ostream::write(this_00,0x5c,__buf,(ulong)((byte)lVar1 - 0x20))
          ;
        }
        __n = (size_t)(((byte)lVar1 >> 4) + 0x37);
        if ((byte)lVar1 < 0xa0) {
          __n = (size_t)(byte)((byte)lVar1 >> 4 | 0x30);
        }
        pcVar2 = prVar5->OutBufCur;
        if (pcVar2 < prVar5->OutBufEnd) {
          prVar5->OutBufCur = pcVar2 + 1;
          *pcVar2 = (char)__n;
        }
        else {
          prVar5 = (raw_ostream *)raw_ostream::write(prVar5,(int)__n,pcVar2,__n);
        }
        cVar3 = (char)(__fd & 0xf);
        bVar4 = cVar3 + 0x37;
        if ((__fd & 0xf) < 10) {
          bVar4 = cVar3 + 0x30;
        }
        __n_00 = (llvm *)(ulong)bVar4;
        __buf = (raw_ostream *)prVar5->OutBufCur;
        if ((raw_ostream *)prVar5->OutBufEnd <= __buf) {
          __fd = (uint)bVar4;
          goto LAB_00185b97;
        }
        prVar5->OutBufCur = (char *)((long)&__buf->_vptr_raw_ostream + 1);
        *(byte *)&__buf->_vptr_raw_ostream = bVar4;
      }
      pcVar6 = pcVar6 + 1;
    } while ((int)Name.Data != (int)pcVar6);
  }
  return;
}

Assistant:

void llvm::printEscapedString(StringRef Name, raw_ostream &Out) {
  for (unsigned i = 0, e = Name.size(); i != e; ++i) {
    unsigned char C = Name[i];
    if (isPrint(C) && C != '\\' && C != '"')
      Out << C;
    else
      Out << '\\' << hexdigit(C >> 4) << hexdigit(C & 0x0F);
  }
}